

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLogSink.h
# Opt level: O2

void __thiscall
MessageLogSink<std::mutex>::registerChatBox
          (MessageLogSink<std::mutex> *this,shared_ptr<gui::ChatBox> *chatBox)

{
  Color *color;
  pointer ppVar1;
  ChatBox *this_00;
  pointer ansiString;
  locale local_58 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_50
  ;
  
  if ((chatBox->super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    ppVar1 = (this->bufferedMessages_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ansiString = (this->bufferedMessages_).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ansiString != ppVar1;
        ansiString = ansiString + 1) {
      this_00 = (chatBox->super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::locale::locale(local_58);
      sf::String::String((String *)&local_50,&ansiString->first,local_58);
      color = &(this->styles_)._M_elems[(int)ansiString->second].first;
      ::gui::ChatBox::addLines(this_00,(String *)&local_50,color,(uint32_t)color[1]);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string(&local_50);
      std::locale::~locale(local_58);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
    ::clear(&this->bufferedMessages_);
  }
  std::__weak_ptr<gui::ChatBox,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<gui::ChatBox,(__gnu_cxx::_Lock_policy)2> *)&this->chatBox_,
             &chatBox->super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void registerChatBox(std::shared_ptr<gui::ChatBox> chatBox) {
        if (chatBox != nullptr) {
            for (const auto& msg : bufferedMessages_) {
                chatBox->addLines(msg.first, styles_[msg.second].first, styles_[msg.second].second);
            }
            bufferedMessages_.clear();
        }
        chatBox_ = chatBox;
    }